

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O2

void __thiscall PDFVersion::getVersion(PDFVersion *this,string *version,int *extension_level)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *extension_level = this->extension_level;
  std::__cxx11::to_string(&local_58,this->major_version);
  std::operator+(&local_78,&local_58,".");
  std::__cxx11::to_string(&sStack_98,this->minor_version);
  std::operator+(&local_38,&local_78,&sStack_98);
  std::__cxx11::string::operator=((string *)version,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void
PDFVersion::getVersion(std::string& version, int& extension_level) const
{
    extension_level = this->extension_level;
    version = std::to_string(this->major_version) + "." + std::to_string(this->minor_version);
}